

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_package.cpp
# Opt level: O3

bool __thiscall
ParsePackage::_PackageVec
          (ParsePackage *this,char *buf,char *end,char type,int index,
          vector<cppnet::Any,_std::allocator<cppnet::Any>_> *vec)

{
  CPlaceHolder *pCVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined *puVar4;
  size_t sVar5;
  undefined7 in_register_00000009;
  uint uVar6;
  Any *operand_00;
  Any *extraout_RDX;
  Any *extraout_RDX_00;
  Any *extraout_RDX_01;
  Any *extraout_RDX_02;
  Any *extraout_RDX_03;
  Any *extraout_RDX_04;
  Any *extraout_RDX_05;
  Any *extraout_RDX_06;
  Any *extraout_RDX_07;
  Any *extraout_RDX_08;
  Any *extraout_RDX_09;
  Any *extraout_RDX_10;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  void *pvVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  s_vec;
  char *local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  Any *operand;
  
  iVar3 = (int)CONCAT71(in_register_00000009,type);
  uVar6 = iVar3 - 0x62;
  operand = (Any *)(ulong)uVar6;
  if (10 < uVar6) {
    if (iVar3 != 0x73) {
      return false;
    }
    pCVar1 = (vec->super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>)._M_impl.
             super__Vector_impl_data._M_start[index]._content;
    if (pCVar1 == (CPlaceHolder *)0x0) {
      puVar4 = &void::typeinfo;
    }
    else {
      iVar3 = (*pCVar1->_vptr_CPlaceHolder[2])();
      puVar4 = (undefined *)CONCAT44(extraout_var_00,iVar3);
      operand = extraout_RDX_00;
    }
    if ((*(char **)(puVar4 + 8) !=
         "St6vectorINSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEESaIS5_EE") &&
       (iVar3 = strcmp("St6vectorINSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEESaIS5_EE",
                       *(char **)(puVar4 + 8)), operand = extraout_RDX_10, iVar3 != 0)) {
      return false;
    }
    cppnet::any_cast<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_58,
               (cppnet *)
               ((vec->super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>)._M_impl.
                super__Vector_impl_data._M_start + index),operand);
    local_60 = (char *)CONCAT44(local_60._4_4_,
                                (int)((ulong)(CONCAT44(local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._12_4_,
                                                  local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_offset) -
                                             CONCAT44(local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p._4_4_,
                                                  (int)local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p)) >> 5));
    bVar2 = _SafeSprintf<int>(this,false,buf,end,"%d,",(int *)&local_60);
    if (bVar2) {
      lVar12 = CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                        (int)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      uVar7 = (ulong)(CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_,
                               local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset)
                     - lVar12) >> 5;
      if (0 < (int)uVar7) {
        sVar5 = strlen(buf);
        pcVar11 = buf + sVar5;
        lVar8 = 0;
        uVar13 = 0;
        do {
          pcVar9 = "%s,";
          if (uVar13 == (int)uVar7 - 1) {
            pcVar9 = "%s|";
          }
          local_60 = *(char **)(lVar12 + lVar8);
          bVar2 = _SafeSprintf<char_const*>(this,true,pcVar11,end,pcVar9,&local_60);
          if (!bVar2) goto LAB_0010b953;
          sVar5 = strlen(pcVar11);
          pcVar11 = pcVar11 + sVar5;
          uVar13 = uVar13 + 1;
          lVar12 = CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                            (int)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          uVar7 = (ulong)(CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_
                                   ,local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                    _M_offset) - lVar12) >> 5;
          lVar8 = lVar8 + 0x20;
        } while ((long)uVar13 < (long)(int)uVar7);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_58);
      return true;
    }
LAB_0010b953:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_58);
    return false;
  }
  operand_00 = (Any *)((long)&switchD_0010b1ed::switchdataD_00122288 +
                      (long)(int)(&switchD_0010b1ed::switchdataD_00122288)[(long)operand]);
  switch(operand) {
  case (Any *)0x0:
    pCVar1 = (vec->super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>)._M_impl.
             super__Vector_impl_data._M_start[index]._content;
    if (pCVar1 == (CPlaceHolder *)0x0) {
      puVar4 = &void::typeinfo;
    }
    else {
      iVar3 = (*pCVar1->_vptr_CPlaceHolder[2])();
      puVar4 = (undefined *)CONCAT44(extraout_var,iVar3);
      operand_00 = extraout_RDX;
    }
    if ((*(char **)(puVar4 + 8) != "St6vectorIbSaIbEE") &&
       (iVar3 = strcmp("St6vectorIbSaIbEE",*(char **)(puVar4 + 8)), operand_00 = extraout_RDX_05,
       iVar3 != 0)) {
      return false;
    }
    cppnet::any_cast<std::vector<bool,std::allocator<bool>>>
              (&local_58,
               (cppnet *)
               ((vec->super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>)._M_impl.
                super__Vector_impl_data._M_start + index),operand_00);
    local_60 = (char *)CONCAT44(local_60._4_4_,
                                ((int)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                      _M_p -
                                (int)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                ) * 8 + local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                        _M_offset);
    bVar2 = _SafeSprintf<int>(this,false,buf,end,"%d,",(int *)&local_60);
    if (bVar2) {
      pvVar10 = (void *)CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p.
                                 _4_4_,(int)local_58.super__Bvector_base<std::allocator<bool>_>.
                                            _M_impl.super__Bvector_impl_data._M_start.
                                            super__Bit_iterator_base._M_p);
      iVar3 = ((int)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
              (int)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
              local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset;
      if (0 < iVar3) {
        sVar5 = strlen(buf);
        pcVar11 = buf + sVar5;
        uVar7 = 0;
        do {
          pcVar9 = "%d|";
          if ((int)uVar7 != iVar3 + -1) {
            pcVar9 = "%d,";
          }
          local_60 = (char *)CONCAT44(local_60._4_4_,
                                      (uint)((*(ulong *)((long)pvVar10 + (uVar7 >> 6) * 8) >>
                                              (uVar7 & 0x3f) & 1) != 0));
          bVar2 = _SafeSprintf<int>(this,true,pcVar11,end,pcVar9,(int *)&local_60);
          if (!bVar2) goto LAB_0010b816;
          sVar5 = strlen(pcVar11);
          pcVar11 = pcVar11 + sVar5;
          uVar6 = (int)uVar7 + 1;
          uVar7 = (ulong)uVar6;
          pvVar10 = (void *)CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                     ._4_4_,(int)local_58.super__Bvector_base<std::allocator<bool>_>
                                                 ._M_impl.super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p);
          iVar3 = ((int)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                  (int)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
                  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
        } while ((int)uVar6 < iVar3);
      }
joined_r0x0010b6f4:
      if (pvVar10 != (void *)0x0) {
        operator_delete(pvVar10);
      }
      return true;
    }
    break;
  case (Any *)0x1:
    pCVar1 = (vec->super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>)._M_impl.
             super__Vector_impl_data._M_start[index]._content;
    if (pCVar1 == (CPlaceHolder *)0x0) {
      puVar4 = &void::typeinfo;
    }
    else {
      iVar3 = (*pCVar1->_vptr_CPlaceHolder[2])();
      puVar4 = (undefined *)CONCAT44(extraout_var_03,iVar3);
      operand_00 = extraout_RDX_03;
    }
    if ((*(char **)(puVar4 + 8) != "St6vectorIcSaIcEE") &&
       (iVar3 = strcmp("St6vectorIcSaIcEE",*(char **)(puVar4 + 8)), operand_00 = extraout_RDX_08,
       iVar3 != 0)) {
      return false;
    }
    cppnet::any_cast<std::vector<char,std::allocator<char>>>
              ((vector<char,_std::allocator<char>_> *)&local_58,
               (cppnet *)
               ((vec->super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>)._M_impl.
                super__Vector_impl_data._M_start + index),operand_00);
    local_60 = (char *)CONCAT44(local_60._4_4_,
                                local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset
                                - (int)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                       _M_p);
    bVar2 = _SafeSprintf<int>(this,false,buf,end,"%d,",(int *)&local_60);
    if (bVar2) {
      pvVar10 = (void *)CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p.
                                 _4_4_,(int)local_58.super__Bvector_base<std::allocator<bool>_>.
                                            _M_impl.super__Bvector_impl_data._M_start.
                                            super__Bit_iterator_base._M_p);
      lVar12 = (ulong)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset -
               (long)pvVar10;
      if (0 < (int)lVar12) {
        sVar5 = strlen(buf);
        pcVar11 = buf + sVar5;
        uVar7 = 0;
        do {
          pcVar9 = "%c,";
          if (uVar7 == (int)lVar12 - 1) {
            pcVar9 = "%c|";
          }
          bVar2 = _SafeSprintf<char&>(this,false,pcVar11,end,pcVar9,(char *)((long)pvVar10 + uVar7))
          ;
          if (!bVar2) goto LAB_0010b816;
          sVar5 = strlen(pcVar11);
          pcVar11 = pcVar11 + sVar5;
          uVar7 = uVar7 + 1;
          pvVar10 = (void *)CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                     ._4_4_,(int)local_58.super__Bvector_base<std::allocator<bool>_>
                                                 ._M_impl.super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p);
          lVar12 = (ulong)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset -
                   (long)pvVar10;
        } while ((long)uVar7 < (long)(int)lVar12);
      }
      goto joined_r0x0010b6f4;
    }
    break;
  case (Any *)0x2:
    pCVar1 = (vec->super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>)._M_impl.
             super__Vector_impl_data._M_start[index]._content;
    if (pCVar1 == (CPlaceHolder *)0x0) {
      puVar4 = &void::typeinfo;
    }
    else {
      iVar3 = (*pCVar1->_vptr_CPlaceHolder[2])();
      puVar4 = (undefined *)CONCAT44(extraout_var_02,iVar3);
      operand_00 = extraout_RDX_02;
    }
    if ((*(char **)(puVar4 + 8) != "St6vectorIdSaIdEE") &&
       (iVar3 = strcmp("St6vectorIdSaIdEE",*(char **)(puVar4 + 8)), operand_00 = extraout_RDX_07,
       iVar3 != 0)) {
      return false;
    }
    cppnet::any_cast<std::vector<double,std::allocator<double>>>
              ((vector<double,_std::allocator<double>_> *)&local_58,
               (cppnet *)
               ((vec->super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>)._M_impl.
                super__Vector_impl_data._M_start + index),operand_00);
    local_60 = (char *)CONCAT44(local_60._4_4_,
                                (int)((ulong)(CONCAT44(local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._12_4_,
                                                  local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_offset) -
                                             CONCAT44(local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p._4_4_,
                                                  (int)local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p)) >> 3));
    bVar2 = _SafeSprintf<int>(this,false,buf,end,"%d,",(int *)&local_60);
    if (bVar2) {
      pvVar10 = (void *)CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p.
                                 _4_4_,(int)local_58.super__Bvector_base<std::allocator<bool>_>.
                                            _M_impl.super__Bvector_impl_data._M_start.
                                            super__Bit_iterator_base._M_p);
      uVar7 = (ulong)(CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_,
                               local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset)
                     - (long)pvVar10) >> 3;
      if (0 < (int)uVar7) {
        sVar5 = strlen(buf);
        pcVar11 = buf + sVar5;
        lVar12 = 0;
        uVar13 = 0;
        do {
          pcVar9 = "%lld,";
          if (uVar13 == (int)uVar7 - 1) {
            pcVar9 = "%lld|";
          }
          bVar2 = _SafeSprintf<double&>
                            (this,true,pcVar11,end,pcVar9,(double *)((long)pvVar10 + lVar12));
          if (!bVar2) goto LAB_0010b816;
          sVar5 = strlen(pcVar11);
          pcVar11 = pcVar11 + sVar5;
          uVar13 = uVar13 + 1;
          pvVar10 = (void *)CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                     ._4_4_,(int)local_58.super__Bvector_base<std::allocator<bool>_>
                                                 ._M_impl.super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p);
          uVar7 = (ulong)(CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_
                                   ,local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                    _M_offset) - (long)pvVar10) >> 3;
          lVar12 = lVar12 + 8;
        } while ((long)uVar13 < (long)(int)uVar7);
      }
      goto joined_r0x0010b6f4;
    }
    break;
  default:
    goto switchD_0010b1ed_caseD_65;
  case (Any *)0x7:
    pCVar1 = (vec->super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>)._M_impl.
             super__Vector_impl_data._M_start[index]._content;
    if (pCVar1 == (CPlaceHolder *)0x0) {
      puVar4 = &void::typeinfo;
    }
    else {
      iVar3 = (*pCVar1->_vptr_CPlaceHolder[2])();
      puVar4 = (undefined *)CONCAT44(extraout_var_04,iVar3);
      operand_00 = extraout_RDX_04;
    }
    if ((*(char **)(puVar4 + 8) != "St6vectorIiSaIiEE") &&
       (iVar3 = strcmp("St6vectorIiSaIiEE",*(char **)(puVar4 + 8)), operand_00 = extraout_RDX_09,
       iVar3 != 0)) {
      return false;
    }
    cppnet::any_cast<std::vector<int,std::allocator<int>>>
              ((vector<int,_std::allocator<int>_> *)&local_58,
               (cppnet *)
               ((vec->super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>)._M_impl.
                super__Vector_impl_data._M_start + index),operand_00);
    local_60 = (char *)CONCAT44(local_60._4_4_,
                                (int)((ulong)(CONCAT44(local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._12_4_,
                                                  local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_offset) -
                                             CONCAT44(local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p._4_4_,
                                                  (int)local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p)) >> 2));
    bVar2 = _SafeSprintf<int>(this,false,buf,end,"%d,",(int *)&local_60);
    if (bVar2) {
      pvVar10 = (void *)CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p.
                                 _4_4_,(int)local_58.super__Bvector_base<std::allocator<bool>_>.
                                            _M_impl.super__Bvector_impl_data._M_start.
                                            super__Bit_iterator_base._M_p);
      uVar7 = (ulong)(CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_,
                               local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset)
                     - (long)pvVar10) >> 2;
      if (0 < (int)uVar7) {
        sVar5 = strlen(buf);
        pcVar11 = buf + sVar5;
        lVar12 = 0;
        uVar13 = 0;
        do {
          pcVar9 = "%d,";
          if (uVar13 == (int)uVar7 - 1) {
            pcVar9 = "%d|";
          }
          bVar2 = _SafeSprintf<int&>(this,false,pcVar11,end,pcVar9,(int *)((long)pvVar10 + lVar12));
          if (!bVar2) goto LAB_0010b816;
          sVar5 = strlen(pcVar11);
          pcVar11 = pcVar11 + sVar5;
          uVar13 = uVar13 + 1;
          pvVar10 = (void *)CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                     ._4_4_,(int)local_58.super__Bvector_base<std::allocator<bool>_>
                                                 ._M_impl.super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p);
          uVar7 = (ulong)(CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_
                                   ,local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                    _M_offset) - (long)pvVar10) >> 2;
          lVar12 = lVar12 + 4;
        } while ((long)uVar13 < (long)(int)uVar7);
      }
      goto joined_r0x0010b6f4;
    }
    break;
  case (Any *)0xa:
    pCVar1 = (vec->super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>)._M_impl.
             super__Vector_impl_data._M_start[index]._content;
    if (pCVar1 == (CPlaceHolder *)0x0) {
      puVar4 = &void::typeinfo;
    }
    else {
      iVar3 = (*pCVar1->_vptr_CPlaceHolder[2])();
      puVar4 = (undefined *)CONCAT44(extraout_var_01,iVar3);
      operand_00 = extraout_RDX_01;
    }
    if ((*(char **)(puVar4 + 8) != "St6vectorIlSaIlEE") &&
       (iVar3 = strcmp("St6vectorIlSaIlEE",*(char **)(puVar4 + 8)), operand_00 = extraout_RDX_06,
       iVar3 != 0)) {
      return false;
    }
    cppnet::any_cast<std::vector<long,std::allocator<long>>>
              ((vector<long,_std::allocator<long>_> *)&local_58,
               (cppnet *)
               ((vec->super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>)._M_impl.
                super__Vector_impl_data._M_start + index),operand_00);
    local_60 = (char *)CONCAT44(local_60._4_4_,
                                (int)((ulong)(CONCAT44(local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._12_4_,
                                                  local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_offset) -
                                             CONCAT44(local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p._4_4_,
                                                  (int)local_58.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_start.
                                                  super__Bit_iterator_base._M_p)) >> 3));
    bVar2 = _SafeSprintf<int>(this,false,buf,end,"%d,",(int *)&local_60);
    if (bVar2) {
      pvVar10 = (void *)CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p.
                                 _4_4_,(int)local_58.super__Bvector_base<std::allocator<bool>_>.
                                            _M_impl.super__Bvector_impl_data._M_start.
                                            super__Bit_iterator_base._M_p);
      uVar7 = (ulong)(CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_,
                               local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset)
                     - (long)pvVar10) >> 3;
      if (0 < (int)uVar7) {
        sVar5 = strlen(buf);
        pcVar11 = buf + sVar5;
        lVar12 = 0;
        uVar13 = 0;
        do {
          pcVar9 = "%ld,";
          if (uVar13 == (int)uVar7 - 1) {
            pcVar9 = "%ld|";
          }
          bVar2 = _SafeSprintf<long&>(this,true,pcVar11,end,pcVar9,(long *)((long)pvVar10 + lVar12))
          ;
          if (!bVar2) goto LAB_0010b816;
          sVar5 = strlen(pcVar11);
          pcVar11 = pcVar11 + sVar5;
          uVar13 = uVar13 + 1;
          pvVar10 = (void *)CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                     ._4_4_,(int)local_58.super__Bvector_base<std::allocator<bool>_>
                                                 ._M_impl.super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p);
          uVar7 = (ulong)(CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_
                                   ,local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                    _M_offset) - (long)pvVar10) >> 3;
          lVar12 = lVar12 + 8;
        } while ((long)uVar13 < (long)(int)uVar7);
      }
      goto joined_r0x0010b6f4;
    }
  }
LAB_0010b816:
  if ((void *)CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                       (int)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) !=
      (void *)0x0) {
    operator_delete((void *)CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                     ._4_4_,(int)local_58.super__Bvector_base<std::allocator<bool>_>
                                                 ._M_impl.super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p));
  }
switchD_0010b1ed_caseD_65:
  return false;
}

Assistant:

bool ParsePackage::_PackageVec(char* buf, char* end, char type, int index, std::vector<cppnet::Any>& vec) {
    char* cur = buf;

    int cur_add = 0;
    int cur_len = 0;

    switch (type) {
    case 'i':
    {
        if (typeid(std::vector<int>) != vec[index].Type()) {
            return false;
        }
        std::vector<int> i_vec = cppnet::any_cast<std::vector<int>>(vec[index]);
        if (!_SafeSprintf(false, cur, end, "%d,", (int)i_vec.size())) {
            return false;
        }
        cur += strlen(cur);

        for (int i = 0; i < (int)i_vec.size(); i++) {
            if (!_SafeSprintf(false, cur, end, ((i == (int)i_vec.size()-1) ? "%d|" : "%d,"), i_vec[i])) {
                return false;
            }
            cur += strlen(cur);
        }
        break;
    }
    case 'c':
    {
        if (typeid(std::vector<char>) != vec[index].Type()) {
            return false;
        }
        std::vector<char> c_vec = cppnet::any_cast<std::vector<char>>(vec[index]);
        if (!_SafeSprintf(false, cur, end, "%d,", (int)c_vec.size())) {
            return false;
        }
        cur += strlen(cur);

        for (int i = 0; i < (int)c_vec.size(); i++) {
            if (!_SafeSprintf(false, cur, end, ((i == (int)c_vec.size() - 1) ? "%c|" : "%c,"), c_vec[i])) {
                return false;
            }
            cur += strlen(cur);
        }
        break;
    }
    case 's':
    {
        if (typeid(std::vector<std::string>) != vec[index].Type()) {
            return false;
        }
        std::vector<std::string> s_vec = cppnet::any_cast<std::vector<std::string>>(vec[index]);
        if (!_SafeSprintf(false, cur, end, "%d,", (int)s_vec.size())) {
            return false;
        }
        cur += strlen(cur);

        for (int i = 0; i < (int)s_vec.size(); i++) {
            if (!_SafeSprintf(true, cur, end, ((i == (int)s_vec.size() - 1) ? "%s|" : "%s,"), s_vec[i].c_str())) {
                return false;
            }
            cur += strlen(cur);
        }
        break;
    }
    case 'd':
    {
        if (typeid(std::vector<double>) != vec[index].Type()) {
            return false;
        }
        std::vector<double> d_vec = cppnet::any_cast<std::vector<double>>(vec[index]);
        if (!_SafeSprintf(false, cur, end, "%d,", (int)d_vec.size())) {
            return false;
        }
        cur += strlen(cur);

        for (int i = 0; i < (int)d_vec.size(); i++) {
            if (!_SafeSprintf(true, cur, end, ((i == (int)d_vec.size() - 1) ? "%lld|" : "%lld,"), d_vec[i])) {
                return false;
            }
            cur += strlen(cur);
        }
        break;
    }
    case 'l':
    {
        if (typeid(std::vector<long>) != vec[index].Type()) {
            return false;
        }
        std::vector<long> l_vec = cppnet::any_cast<std::vector<long>>(vec[index]);
        if (!_SafeSprintf(false, cur, end, "%d,", (int)l_vec.size())) {
            return false;
        }
        cur += strlen(cur);

        for (int i = 0; i < (int)l_vec.size(); i++) {
            if (!_SafeSprintf(true, cur, end, ((i == (int)l_vec.size() - 1) ? "%ld|" : "%ld,"), l_vec[i])) {
                return false;
            }
            cur += strlen(cur);
        }
        break;
    }
    case 'b':
    {
        if (typeid(std::vector<bool>) != vec[index].Type()) {
            return false;
        }
        std::vector<bool> b_vec = cppnet::any_cast<std::vector<bool>>(vec[index]);
        if (!_SafeSprintf(false, cur, end, "%d,", (int)b_vec.size())) {
            return false;
        }
        cur += strlen(cur);

        for (int i = 0; i < (int)b_vec.size(); i++) {
            if (!_SafeSprintf(true, cur, end, ((i == (int)b_vec.size() - 1) ? "%d|" : "%d,"), b_vec[i]?1:0)) {
                return false;
            }
            cur += strlen(cur);
        }
        break;
    }
    default:
        return false;
    }
    return true;;
}